

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseBinding.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sparse::anon_unknown_2::BufferSparseBindingInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferSparseBindingInstance *this)

{
  int *piVar1;
  VkSparseMemoryBind **ppVVar2;
  Handle<(vk::HandleType)7> vk;
  Handle<(vk::HandleType)7> HVar3;
  void *__s2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  VkBuffer VVar6;
  undefined8 uVar7;
  VkDeviceSize VVar8;
  undefined8 buffer;
  undefined8 obj;
  undefined8 commandBuffer;
  void *pvVar9;
  undefined8 uVar10;
  deUint32 memoryType;
  VkResult result;
  int iVar11;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  Queue *pQVar12;
  Queue *pQVar13;
  Handle<(vk::HandleType)7> HVar14;
  Handle<(vk::HandleType)7> *pHVar15;
  NotSupportedError *pNVar16;
  size_t __n;
  deUint32 dVar17;
  ulong uVar18;
  VkSparseBufferMemoryBindInfo sparseBufferBindInfo;
  deUint32 queueFamilyIndices [2];
  VkBufferCreateInfo outputBufferCreateInfo;
  vector<unsigned_char,_std::allocator<unsigned_char>_> referenceData;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_4a0;
  VkBuffer local_488;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_480;
  VkBuffer local_468;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_460;
  VkPipelineStageFlags waitStageBits [1];
  VkSemaphore local_418;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_410;
  VkBufferCreateInfo bufferCreateInfo;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  VkMemoryRequirements bufferMemRequirement;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_380;
  VkBufferCreateInfo inputBufferCreateInfo;
  VkBool32 local_2b8;
  ulong local_208;
  
  vk_00 = Context::getInstanceInterface
                    ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  physicalDevice =
       Context::getPhysicalDevice
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)&inputBufferCreateInfo,vk_00,physicalDevice);
  if (local_2b8 == 0) {
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar16,"Sparse binding not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseBinding.cpp"
               ,0x68);
    __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputBufferCreateInfo._4_4_ = 0;
  inputBufferCreateInfo.pNext = (void *)0x0;
  inputBufferCreateInfo.flags = 0;
  inputBufferCreateInfo._20_4_ = 0;
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  bufferCreateInfo._4_4_ = 1;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              *)&inputBufferCreateInfo,(QueueRequirements *)&bufferCreateInfo);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
  bufferCreateInfo._4_4_ = 1;
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  emplace_back<vkt::sparse::QueueRequirements>
            ((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
              *)&inputBufferCreateInfo,(QueueRequirements *)&bufferCreateInfo);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,(QueueRequirementsVec *)&inputBufferCreateInfo
            );
  if (inputBufferCreateInfo._0_8_ != 0) {
    operator_delete((void *)inputBufferCreateInfo._0_8_,
                    inputBufferCreateInfo._16_8_ - inputBufferCreateInfo._0_8_);
  }
  vk.m_internal =
       (deUint64)
       (this->super_SparseResourcesBaseInstance).m_deviceDriver.
       super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pQVar12 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  pQVar13 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
  bufferCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateInfo.pNext = (void *)0x0;
  bufferCreateInfo.flags = 1;
  bufferCreateInfo.size = (VkDeviceSize)this->m_bufferSize;
  bufferCreateInfo.usage = 3;
  bufferCreateInfo.queueFamilyIndexCount = 0;
  bufferCreateInfo.pQueueFamilyIndices = (deUint32 *)0x0;
  queueFamilyIndices[0] = pQVar12->queueFamilyIndex;
  queueFamilyIndices[1] = pQVar13->queueFamilyIndex;
  if (queueFamilyIndices[0] != queueFamilyIndices[1]) {
    bufferCreateInfo.queueFamilyIndexCount = 2;
    bufferCreateInfo.pQueueFamilyIndices = queueFamilyIndices;
  }
  bufferCreateInfo.sharingMode = (VkSharingMode)(queueFamilyIndices[0] != queueFamilyIndices[1]);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&inputBufferCreateInfo,
                     (DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,&bufferCreateInfo,
                     (VkAllocationCallbacks *)0x0);
  buffer = inputBufferCreateInfo._0_8_;
  DStack_4a0.m_device = (VkDevice)inputBufferCreateInfo._16_8_;
  DStack_4a0.m_allocator = (VkAllocationCallbacks *)inputBufferCreateInfo.size;
  DStack_4a0.m_deviceIface = (DeviceInterface *)inputBufferCreateInfo.pNext;
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&inputBufferCreateInfo,
             (DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,0,(VkAllocationCallbacks *)0x0);
  DStack_410.m_device = (VkDevice)inputBufferCreateInfo._16_8_;
  DStack_410.m_allocator = (VkAllocationCallbacks *)inputBufferCreateInfo.size;
  local_418.m_internal = inputBufferCreateInfo._0_8_;
  DStack_410.m_deviceIface = (DeviceInterface *)inputBufferCreateInfo.pNext;
  ::vk::getBufferMemoryRequirements
            (&bufferMemRequirement,(DeviceInterface *)vk.m_internal,
             (this->super_SparseResourcesBaseInstance).m_logicalDevice.
             super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkBuffer)buffer);
  VVar8 = bufferMemRequirement.size;
  ::vk::getPhysicalDeviceProperties
            ((VkPhysicalDeviceProperties *)&inputBufferCreateInfo,vk_00,physicalDevice);
  if (VVar8 <= local_208) {
    deviceMemUniquePtrVec.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    deviceMemUniquePtrVec.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    deviceMemUniquePtrVec.
    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    outputBufferCreateInfo.flags = 0;
    outputBufferCreateInfo._20_4_ = 0;
    outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    outputBufferCreateInfo._4_4_ = 0;
    outputBufferCreateInfo.pNext = (void *)0x0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = bufferMemRequirement.alignment;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = bufferMemRequirement.size;
    memoryType = findMatchingMemoryType
                           (vk_00,physicalDevice,&bufferMemRequirement,
                            (MemoryRequirement *)&::vk::MemoryRequirement::Any);
    if (memoryType == 0xffffffff) {
      inputBufferCreateInfo._0_8_ = &inputBufferCreateInfo.flags;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&inputBufferCreateInfo,"No matching memory type found","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,inputBufferCreateInfo._0_8_,
                 (long)inputBufferCreateInfo.pNext + inputBufferCreateInfo._0_8_);
      if ((VkBufferCreateFlags *)inputBufferCreateInfo._0_8_ != &inputBufferCreateInfo.flags) {
        operator_delete((void *)inputBufferCreateInfo._0_8_,inputBufferCreateInfo._16_8_ + 1);
      }
    }
    else {
      dVar17 = SUB164(auVar5 / auVar4,0);
      if (dVar17 != 0) {
        uVar18 = 0;
        do {
          makeSparseMemoryBind
                    ((VkSparseMemoryBind *)&inputBufferCreateInfo,(DeviceInterface *)vk.m_internal,
                     (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                     super_RefBase<vk::VkDevice_s_*>.m_data.object,bufferMemRequirement.alignment,
                     memoryType,bufferMemRequirement.alignment * uVar18);
          HVar14.m_internal =
               (deUint64)
               ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                         ((Handle<(vk::HandleType)7>)inputBufferCreateInfo._16_8_);
          HVar3.m_internal =
               (deUint64)
               (this->super_SparseResourcesBaseInstance).m_logicalDevice.
               super_RefBase<vk::VkDevice_s_*>.m_data.object;
          pHVar15 = (Handle<(vk::HandleType)7> *)operator_new(0x20);
          pHVar15[2].m_internal = HVar3.m_internal;
          pHVar15[3].m_internal = 0;
          pHVar15->m_internal = HVar14.m_internal;
          pHVar15[1].m_internal = vk.m_internal;
          sparseBufferBindInfo.bindCount = 0;
          sparseBufferBindInfo._12_4_ = 0;
          sparseBufferBindInfo.buffer.m_internal = (deUint64)pHVar15;
          sparseBufferBindInfo._8_8_ = operator_new(0x20);
          *(undefined4 *)(sparseBufferBindInfo._8_8_ + 8) = 0;
          *(undefined4 *)(sparseBufferBindInfo._8_8_ + 0xc) = 0;
          *(undefined ***)sparseBufferBindInfo._8_8_ = &PTR__SharedPtrState_00cef0b0;
          *(Handle<(vk::HandleType)7> **)(sparseBufferBindInfo._8_8_ + 0x10) = pHVar15;
          *(undefined4 *)(sparseBufferBindInfo._8_8_ + 8) = 1;
          *(undefined4 *)(sparseBufferBindInfo._8_8_ + 0xc) = 1;
          std::
          vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
          ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>
                    ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>>>>>
                      *)&deviceMemUniquePtrVec,
                     (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_> *)
                     &sparseBufferBindInfo);
          if (sparseBufferBindInfo._8_8_ != 0) {
            LOCK();
            piVar1 = (int *)(sparseBufferBindInfo._8_8_ + 8);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              sparseBufferBindInfo.buffer.m_internal = 0;
              (**(code **)(*(long *)sparseBufferBindInfo._8_8_ + 0x10))();
            }
            LOCK();
            piVar1 = (int *)(sparseBufferBindInfo._8_8_ + 0xc);
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              if (sparseBufferBindInfo._8_8_ != 0) {
                (**(code **)(*(long *)sparseBufferBindInfo._8_8_ + 8))();
              }
              sparseBufferBindInfo.bindCount = 0;
              sparseBufferBindInfo._12_4_ = 0;
            }
          }
          if (outputBufferCreateInfo.pNext == (void *)outputBufferCreateInfo._16_8_) {
            std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
            _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                      ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>> *)
                       &outputBufferCreateInfo,(iterator)outputBufferCreateInfo.pNext,
                       (VkSparseMemoryBind *)&inputBufferCreateInfo);
          }
          else {
            *(ulong *)((long)outputBufferCreateInfo.pNext + 0x20) =
                 CONCAT44(inputBufferCreateInfo.sharingMode,inputBufferCreateInfo.usage);
            *(undefined8 *)((long)outputBufferCreateInfo.pNext + 0x10) =
                 inputBufferCreateInfo._16_8_;
            *(VkDeviceSize *)((long)outputBufferCreateInfo.pNext + 0x18) =
                 inputBufferCreateInfo.size;
            *(undefined8 *)outputBufferCreateInfo.pNext = inputBufferCreateInfo._0_8_;
            *(void **)((long)outputBufferCreateInfo.pNext + 8) = inputBufferCreateInfo.pNext;
            outputBufferCreateInfo.pNext = (void *)((long)outputBufferCreateInfo.pNext + 0x28);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < (SUB168(auVar5 / auVar4,0) & 0xffffffff));
      }
      inputBufferCreateInfo._40_8_ = &sparseBufferBindInfo;
      sparseBufferBindInfo.buffer.m_internal = buffer;
      sparseBufferBindInfo.bindCount = dVar17;
      sparseBufferBindInfo.pBinds = (VkSparseMemoryBind *)outputBufferCreateInfo._0_8_;
      inputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
      inputBufferCreateInfo.pNext = (void *)0x0;
      inputBufferCreateInfo._16_8_ = inputBufferCreateInfo._16_8_ & 0xffffffff00000000;
      inputBufferCreateInfo.size = 0;
      inputBufferCreateInfo.usage = 1;
      inputBufferCreateInfo.pQueueFamilyIndices._0_4_ = 0;
      result = (*(*(_func_int ***)vk.m_internal)[0x11])(vk.m_internal,pQVar12->queueHandle,1);
      ::vk::checkResult(result,
                        "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseBinding.cpp"
                        ,0xbf);
    }
    if (outputBufferCreateInfo._0_8_ != 0) {
      operator_delete((void *)outputBufferCreateInfo._0_8_,
                      outputBufferCreateInfo._16_8_ - outputBufferCreateInfo._0_8_);
    }
    if (memoryType != 0xffffffff) {
      makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&inputBufferCreateInfo,
                      (DeviceInterface *)vk.m_internal,
                      (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                      super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar13->queueFamilyIndex);
      obj = inputBufferCreateInfo._0_8_;
      DStack_380.m_device = (VkDevice)inputBufferCreateInfo._16_8_;
      DStack_380.m_allocator = (VkAllocationCallbacks *)inputBufferCreateInfo.size;
      DStack_380.m_deviceIface = (DeviceInterface *)inputBufferCreateInfo.pNext;
      ::vk::allocateCommandBuffer
                ((Move<vk::VkCommandBuffer_s_*> *)&inputBufferCreateInfo,
                 (DeviceInterface *)vk.m_internal,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkCommandPool)inputBufferCreateInfo._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
      VVar8 = inputBufferCreateInfo.size;
      uVar10 = inputBufferCreateInfo._16_8_;
      pvVar9 = inputBufferCreateInfo.pNext;
      commandBuffer = inputBufferCreateInfo._0_8_;
      beginCommandBuffer((DeviceInterface *)vk.m_internal,
                         (VkCommandBuffer)inputBufferCreateInfo._0_8_);
      makeBufferCreateInfo(&inputBufferCreateInfo,(ulong)this->m_bufferSize,1);
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&outputBufferCreateInfo,
                         (DeviceInterface *)vk.m_internal,
                         (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                         super_RefBase<vk::VkDevice_s_*>.m_data.object,&inputBufferCreateInfo,
                         (VkAllocationCallbacks *)0x0);
      DStack_460.m_device = (VkDevice)outputBufferCreateInfo._16_8_;
      DStack_460.m_allocator = (VkAllocationCallbacks *)outputBufferCreateInfo.size;
      local_468.m_internal = outputBufferCreateInfo._0_8_;
      DStack_460.m_deviceIface = (DeviceInterface *)outputBufferCreateInfo.pNext;
      bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                 &outputBufferCreateInfo,(DeviceInterface *)vk.m_internal,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (this->super_SparseResourcesBaseInstance).m_allocator.
                 super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                 (VkBuffer)outputBufferCreateInfo._0_8_,(MemoryRequirement)0x1);
      uVar7 = outputBufferCreateInfo._0_8_;
      referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&referenceData,(ulong)this->m_bufferSize);
      if (this->m_bufferSize == 0) {
        __n = 0;
      }
      else {
        uVar18 = 0;
        do {
          referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] =
               (char)(uVar18 % bufferMemRequirement.alignment) + '\x01';
          uVar18 = uVar18 + 1;
          __n = (size_t)this->m_bufferSize;
        } while (uVar18 < __n);
      }
      memcpy(*(void **)(uVar7 + 0x18),
             referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,__n);
      ::vk::flushMappedMemoryRange
                ((DeviceInterface *)vk.m_internal,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkDeviceMemory)*(deUint64 *)(uVar7 + 8),*(VkDeviceSize *)(uVar7 + 0x10),
                 (ulong)this->m_bufferSize);
      makeBufferMemoryBarrier
                ((VkBufferMemoryBarrier *)&outputBufferCreateInfo,0x4000,0x800,local_468,0,
                 (ulong)this->m_bufferSize);
      (*(*(_func_int ***)vk.m_internal)[0x6d])
                (vk.m_internal,commandBuffer,0x4000,0x1000,0,0,0,1,
                 (VkBufferMemoryBarrier *)&outputBufferCreateInfo,0,0);
      outputBufferCreateInfo._16_8_ = ZEXT48(this->m_bufferSize);
      outputBufferCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      outputBufferCreateInfo._4_4_ = 0;
      outputBufferCreateInfo.pNext = (void *)0x0;
      (*(*(_func_int ***)vk.m_internal)[0x5f])
                (vk.m_internal,commandBuffer,local_468.m_internal,buffer);
      makeBufferMemoryBarrier
                ((VkBufferMemoryBarrier *)&outputBufferCreateInfo,0x1000,0x800,(VkBuffer)buffer,0,
                 (ulong)this->m_bufferSize);
      (*(*(_func_int ***)vk.m_internal)[0x6d])
                (vk.m_internal,commandBuffer,0x1000,0x1000,0,0,0,1,
                 (VkBufferMemoryBarrier *)&outputBufferCreateInfo,0,0);
      makeBufferCreateInfo(&outputBufferCreateInfo,(ulong)this->m_bufferSize,2);
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&sparseBufferBindInfo,
                         (DeviceInterface *)vk.m_internal,
                         (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                         super_RefBase<vk::VkDevice_s_*>.m_data.object,&outputBufferCreateInfo,
                         (VkAllocationCallbacks *)0x0);
      DStack_480.m_device = (VkDevice)sparseBufferBindInfo.pBinds;
      local_488.m_internal = sparseBufferBindInfo.buffer.m_internal;
      DStack_480.m_deviceIface = (DeviceInterface *)sparseBufferBindInfo._8_8_;
      bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                 &sparseBufferBindInfo,(DeviceInterface *)vk.m_internal,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (this->super_SparseResourcesBaseInstance).m_allocator.
                 super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr,
                 sparseBufferBindInfo.buffer,(MemoryRequirement)0x1);
      VVar6 = sparseBufferBindInfo.buffer;
      sparseBufferBindInfo.pBinds = (VkSparseMemoryBind *)(ulong)this->m_bufferSize;
      sparseBufferBindInfo.buffer.m_internal = 0;
      sparseBufferBindInfo.bindCount = 0;
      sparseBufferBindInfo._12_4_ = 0;
      (*(*(_func_int ***)vk.m_internal)[0x5f])
                (vk.m_internal,commandBuffer,buffer,local_488.m_internal);
      makeBufferMemoryBarrier
                ((VkBufferMemoryBarrier *)&sparseBufferBindInfo,0x1000,0x2000,local_488,0,
                 (ulong)this->m_bufferSize);
      (*(*(_func_int ***)vk.m_internal)[0x6d])
                (vk.m_internal,commandBuffer,0x1000,0x4000,0,0,0,1,
                 (VkBufferMemoryBarrier *)&sparseBufferBindInfo,0,0);
      endCommandBuffer((DeviceInterface *)vk.m_internal,(VkCommandBuffer)commandBuffer);
      waitStageBits[0] = 0x1000;
      submitCommandsAndWait
                ((DeviceInterface *)vk.m_internal,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,pQVar13->queueHandle,
                 (VkCommandBuffer)commandBuffer,1,&local_418,waitStageBits,0,(VkSemaphore *)0x0);
      ::vk::invalidateMappedMemoryRange
                ((DeviceInterface *)vk.m_internal,
                 (this->super_SparseResourcesBaseInstance).m_logicalDevice.
                 super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkDeviceMemory)*(deUint64 *)(VVar6.m_internal + 8),
                 *(VkDeviceSize *)(VVar6.m_internal + 0x10),(ulong)this->m_bufferSize);
      __s2 = *(void **)(VVar6.m_internal + 0x18);
      (*(*(_func_int ***)vk.m_internal)[3])(vk.m_internal,pQVar12->queueHandle);
      iVar11 = bcmp(referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,__s2,(ulong)this->m_bufferSize);
      ppVVar2 = &sparseBufferBindInfo.pBinds;
      sparseBufferBindInfo.buffer.m_internal = (deUint64)ppVVar2;
      if (iVar11 == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&sparseBufferBindInfo,"Passed","")
        ;
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   sparseBufferBindInfo.buffer.m_internal,
                   sparseBufferBindInfo._8_8_ + sparseBufferBindInfo.buffer.m_internal);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&sparseBufferBindInfo,"Failed","")
        ;
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   sparseBufferBindInfo.buffer.m_internal,
                   sparseBufferBindInfo._8_8_ + sparseBufferBindInfo.buffer.m_internal);
      }
      if ((VkSparseMemoryBind **)sparseBufferBindInfo.buffer.m_internal != ppVVar2) {
        operator_delete((void *)sparseBufferBindInfo.buffer.m_internal,
                        (ulong)((long)&(sparseBufferBindInfo.pBinds)->resourceOffset + 1));
      }
      (**(code **)(*(long *)VVar6.m_internal + 8))(VVar6.m_internal);
      if (local_488.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_480,local_488)
        ;
      }
      if (referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(referenceData.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)referenceData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)referenceData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      (**(code **)(*(long *)uVar7 + 8))(uVar7);
      if (local_468.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_460,local_468)
        ;
      }
      if (commandBuffer != 0) {
        inputBufferCreateInfo._0_8_ = commandBuffer;
        (**(code **)(*pvVar9 + 0x240))(pvVar9,uVar10,VVar8,1);
      }
      if (obj != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  (&DStack_380,(VkCommandPool)obj);
      }
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
    ::~vector(&deviceMemUniquePtrVec);
    if (local_418.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()(&DStack_410,local_418);
    }
    if (buffer != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                (&DStack_4a0,(VkBuffer)buffer);
    }
    return __return_storage_ptr__;
  }
  pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar16,"Required memory size for sparse resources exceeds device limits",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseBinding.cpp"
             ,0x95);
  __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus BufferSparseBindingInstance::iterate (void)
{
	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	if (!getPhysicalDeviceFeatures(instance, physicalDevice).sparseBinding)
		TCU_THROW(NotSupportedError, "Sparse binding not supported");

	{
		// Create logical device supporting both sparse and compute operations
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	VkBufferCreateInfo bufferCreateInfo;

	bufferCreateInfo.sType					= VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;	// VkStructureType		sType;
	bufferCreateInfo.pNext					= DE_NULL;								// const void*			pNext;
	bufferCreateInfo.flags					= VK_BUFFER_CREATE_SPARSE_BINDING_BIT;	// VkBufferCreateFlags	flags;
	bufferCreateInfo.size					= m_bufferSize;							// VkDeviceSize			size;
	bufferCreateInfo.usage					= VK_BUFFER_USAGE_TRANSFER_SRC_BIT |
											  VK_BUFFER_USAGE_TRANSFER_DST_BIT;		// VkBufferUsageFlags	usage;
	bufferCreateInfo.sharingMode			= VK_SHARING_MODE_EXCLUSIVE;			// VkSharingMode		sharingMode;
	bufferCreateInfo.queueFamilyIndexCount	= 0u;									// deUint32				queueFamilyIndexCount;
	bufferCreateInfo.pQueueFamilyIndices	= DE_NULL;								// const deUint32*		pQueueFamilyIndices;

	const deUint32 queueFamilyIndices[] = { sparseQueue.queueFamilyIndex, computeQueue.queueFamilyIndex };

	if (sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex)
	{
		bufferCreateInfo.sharingMode			= VK_SHARING_MODE_CONCURRENT;	// VkSharingMode		sharingMode;
		bufferCreateInfo.queueFamilyIndexCount	= 2u;							// deUint32				queueFamilyIndexCount;
		bufferCreateInfo.pQueueFamilyIndices	= queueFamilyIndices;			// const deUint32*		pQueueFamilyIndices;
	}

	// Create sparse buffer
	const Unique<VkBuffer> sparseBuffer(createBuffer(deviceInterface, getDevice(), &bufferCreateInfo));

	// Create sparse buffer memory bind semaphore
	const Unique<VkSemaphore> bufferMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	const VkMemoryRequirements bufferMemRequirement = getBufferMemoryRequirements(deviceInterface, getDevice(), *sparseBuffer);

	if (bufferMemRequirement.size > getPhysicalDeviceProperties(instance, physicalDevice).limits.sparseAddressSpaceSize)
		TCU_THROW(NotSupportedError, "Required memory size for sparse resources exceeds device limits");

	DE_ASSERT((bufferMemRequirement.size % bufferMemRequirement.alignment) == 0);

	std::vector<DeviceMemorySp> deviceMemUniquePtrVec;

	{
		std::vector<VkSparseMemoryBind>	sparseMemoryBinds;
		const deUint32					numSparseBinds = static_cast<deUint32>(bufferMemRequirement.size / bufferMemRequirement.alignment);
		const deUint32					memoryType = findMatchingMemoryType(instance, physicalDevice, bufferMemRequirement, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseBinds; ++sparseBindNdx)
		{
			const VkSparseMemoryBind sparseMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(), bufferMemRequirement.alignment, memoryType, bufferMemRequirement.alignment * sparseBindNdx);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(sparseMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			sparseMemoryBinds.push_back(sparseMemoryBind);
		}

		const VkSparseBufferMemoryBindInfo sparseBufferBindInfo = makeSparseBufferMemoryBindInfo(*sparseBuffer, numSparseBinds, &sparseMemoryBinds[0]);

		const VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			1u,											//deUint32									bufferBindCount;
			&sparseBufferBindInfo,						//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&bufferMemoryBindSemaphore.get()			//const VkSemaphore*						pSignalSemaphores;
		};

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for transfer oparations
	const Unique<VkCommandPool>		commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer>	commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording transfer commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	const VkBufferCreateInfo		inputBufferCreateInfo = makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_TRANSFER_SRC_BIT);
	const Unique<VkBuffer>			inputBuffer				(createBuffer(deviceInterface, getDevice(), &inputBufferCreateInfo));
	const de::UniquePtr<Allocation>	inputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *inputBuffer, MemoryRequirement::HostVisible));

	std::vector<deUint8> referenceData;
	referenceData.resize(m_bufferSize);

	for (deUint32 valueNdx = 0; valueNdx < m_bufferSize; ++valueNdx)
	{
		referenceData[valueNdx] = static_cast<deUint8>((valueNdx % bufferMemRequirement.alignment) + 1u);
	}

	deMemcpy(inputBufferAlloc->getHostPtr(), &referenceData[0], m_bufferSize);

	flushMappedMemoryRange(deviceInterface, getDevice(), inputBufferAlloc->getMemory(), inputBufferAlloc->getOffset(), m_bufferSize);

	{
		const VkBufferMemoryBarrier inputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_HOST_WRITE_BIT,
										VK_ACCESS_TRANSFER_READ_BIT,
										*inputBuffer,
										0u,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &inputBufferBarrier, 0u, DE_NULL);
	}

	{
		const VkBufferCopy bufferCopy = makeBufferCopy(0u, 0u, m_bufferSize);

		deviceInterface.cmdCopyBuffer(*commandBuffer, *inputBuffer, *sparseBuffer, 1u, &bufferCopy);
	}

	{
		const VkBufferMemoryBarrier sparseBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
										VK_ACCESS_TRANSFER_READ_BIT,
										*sparseBuffer,
										0u,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &sparseBufferBarrier, 0u, DE_NULL);
	}

	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	{
		const VkBufferCopy bufferCopy = makeBufferCopy(0u, 0u, m_bufferSize);

		deviceInterface.cmdCopyBuffer(*commandBuffer, *sparseBuffer, *outputBuffer, 1u, &bufferCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
										VK_ACCESS_HOST_READ_BIT,
										*outputBuffer,
										0u,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferBarrier, 0u, DE_NULL);
	}

	// End recording transfer commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	const VkPipelineStageFlags waitStageBits[] = { VK_PIPELINE_STAGE_TRANSFER_BIT };

	// Submit transfer commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &bufferMemoryBindSemaphore.get(), waitStageBits);

	// Retrieve data from output buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), m_bufferSize);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Compare output data with reference data
	if (deMemCmp(&referenceData[0], outputData, m_bufferSize) != 0)
		return tcu::TestStatus::fail("Failed");
	else
		return tcu::TestStatus::pass("Passed");
}